

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O3

bool TestHashList<unsigned_int>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes,bool drawDiagram,
               bool testCollision,bool testDist,bool testHighBits,bool testLowBits)

{
  pointer puVar1;
  uint uVar2;
  pointer puVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  undefined7 in_register_00000011;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> revhashes;
  HashSet<unsigned_int> collisions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  bVar4 = true;
  if ((int)CONCAT71(in_register_00000011,testCollision) != 0) {
    iVar6 = (int)((ulong)((long)(hashes->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(hashes->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
    auVar15._0_8_ = (double)iVar6;
    dVar13 = ldexp(1.0,0x20);
    auVar14._0_8_ = (auVar15._0_8_ * (double)(iVar6 + -1)) / dVar13;
    auVar14._8_8_ = 0;
    auVar15._8_8_ = 0;
    auVar14 = vminsd_avx(auVar15,auVar14);
    printf("Testing collisions (%3i-bit) - Expected %6.1f, ",0x20);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar7 = FindCollisions<unsigned_int>(hashes,(HashSet<unsigned_int> *)&local_60,1000);
    dVar13 = (double)(int)uVar7 / auVar14._0_8_;
    printf("actual %6i (%.2fx)",(ulong)uVar7);
    bVar4 = dVar13 <= 2.0;
    if (!bVar4) {
      printf(" !!!!!");
    }
    putchar(10);
    fflush((FILE *)0x0);
    if (testHighBits) {
      bVar4 = TestHighbitsCollisions<unsigned_int>(hashes);
      bVar4 = dVar13 <= 2.0 && bVar4;
    }
    if (testLowBits) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_78,hashes);
      puVar3 = local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        puVar1 = (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2;
        lVar9 = 0;
        do {
          uVar7 = puVar1[lVar9];
          uVar10 = 0xfffffffffffffff8;
          uVar12 = 0;
          do {
            uVar11 = uVar7 & 0xf;
            uVar2 = uVar7 >> 4;
            uVar7 = uVar7 >> 8;
            uVar10 = uVar10 + 8;
            uVar12 = (uint)(byte)(bitrev(unsigned_char)::revbits[uVar11] << 4 |
                                 bitrev(unsigned_char)::revbits[uVar2 & 0xf]) | uVar12 << 8;
          } while (uVar10 < 0x18);
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9] = uVar12;
          lVar9 = lVar9 + 1;
        } while (lVar9 != lVar8 + (ulong)(lVar8 == 0));
        if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar8) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar3,local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      bVar5 = TestLowbitsCollisions<unsigned_int>(&local_78);
      if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      bVar4 = (bool)(bVar4 & bVar5);
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_60);
  }
  if (testDist) {
    bVar5 = TestDistribution<unsigned_int>(hashes,drawDiagram);
    bVar4 = bVar4 != false && bVar5;
  }
  return bVar4;
}

Assistant:

bool TestHashList ( std::vector<hashtype> & hashes, bool drawDiagram,
                    bool testCollision = true, bool testDist = true,
                    bool testHighBits = true, bool testLowBits = true )
{
  bool result = true;

  if (testCollision)
  {
    size_t const count = hashes.size();
    double const expected = EstimateNbCollisions(count, sizeof(hashtype) * 8);
    printf("Testing collisions (%3i-bit) - Expected %6.1f, ",
           (int)sizeof(hashtype)*8, expected);

    double collcount = 0;
    HashSet<hashtype> collisions;
    collcount = FindCollisions(hashes, collisions, 1000);
    printf("actual %6i (%.2fx)", (int)collcount, collcount / expected);

    if(sizeof(hashtype) == sizeof(uint32_t))
    {
    // 2x expected collisions = fail

    // #TODO - collision failure cutoff needs to be expressed as a standard deviation instead
    // of a scale factor, otherwise we fail erroneously if there are a small expected number
    // of collisions

        if ((collcount / expected) > 2.0)
        {
          printf(" !!!!!");
          result = false;
        }
    }
    else
    {
      // For all hashes larger than 32 bits, _any_ collisions are a failure.

      if(collcount > 0)
      {
        printf(" !!!!!");
        result = false;
        //if(drawDiagram) PrintCollisions(hashes, collisions);
      }
    }

    printf("\n");
    fflush(NULL);

    if (testHighBits) {
      result &= CountHighbitsCollisions(hashes, 224);
      result &= CountHighbitsCollisions(hashes, 160);
      result &= CountHighbitsCollisions(hashes, 128);
      result &= CountHighbitsCollisions(hashes,  64);
      result &= CountHighbitsCollisions(hashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountHighbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestHighbitsCollisions(hashes);

      /* Following tests are too small : tables are necessarily saturated.
       * It would be better to count the nb of collisions per Cell,
       * and compared the distribution of values against a random source.
       * But this is a different test */
      //result &= CountHighbitsCollisions(hashes,   12);
      //result &= CountHighbitsCollisions(hashes,   8);
    }
    if (testLowBits) {
      // reverse: bitwise flip the hashes. lowest bits first
      std::vector<hashtype> revhashes = hashes;
      for (size_t i = 0; i < revhashes.size(); i++) {
        revhashes[i] = bitreverse(hashes[i]);
      }
      std::sort(revhashes.begin(), revhashes.end());

      result &= CountLowbitsCollisions(revhashes, 224);
      result &= CountLowbitsCollisions(revhashes, 160);
      result &= CountLowbitsCollisions(revhashes, 128);
      result &= CountLowbitsCollisions(revhashes,  64);
      result &= CountLowbitsCollisions(revhashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountLowbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestLowbitsCollisions(revhashes);
      /* Following tests are too small : tables are necessarily saturated.
       * It would be better to count the nb of collisions per Cell,
       * and compared the distribution of values against a random source.
       * But this is a different test */
      //result &= CountLowbitsCollisions(revhashes,   12);
      //result &= CountLowbitsCollisions(revhashes,   8);

      //std::vector<hashtype>().swap(revhashes);
      //revhashes.clear();
    }
  }


  //----------

  if(testDist)
  {
    result &= TestDistribution(hashes,drawDiagram);
  }

  return result;
}